

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

Variant * __thiscall
Jinx::Impl::Script::GetVariable(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  pointer pVVar1;
  pointer pIVar2;
  long lVar3;
  pointer pIVar4;
  
  pIVar2 = (this->m_idIndexData).
           super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pIVar4 = pIVar2;
    if (pIVar4 == (this->m_idIndexData).
                  super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_001c455b;
    pIVar2 = pIVar4 + -1;
  } while (pIVar4[-1].id != id);
  pVVar1 = (this->m_stack).
           super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->m_stack).
                super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (pIVar4[-1].index < (ulong)(lVar3 / 0x28)) {
    Jinx::Variant::Copy(__return_storage_ptr__,pVVar1 + pIVar4[-1].index);
  }
  else {
    LogWriteLine(Error,"Attempted to access stack at invalid index",lVar3 % 0x28);
LAB_001c455b:
    __return_storage_ptr__->m_type = Null;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Variant Script::GetVariable(RuntimeID id) const
	{
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->id == id)
			{
				if (ritr->index >= m_stack.size())
				{
					LogWriteLine(LogLevel::Error, "Attempted to access stack at invalid index");
					return Variant();
				}
				return m_stack[ritr->index];
			}
		}
		return Variant();
	}